

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_parse_result *
pugi::impl::anon_unknown_0::load_buffer_impl
          (xml_parse_result *__return_storage_ptr__,xml_document_struct *doc,xml_node_struct *root,
          void *contents,size_t size,uint options,xml_encoding encoding,bool is_mutable,bool own,
          char_t **out_buffer)

{
  xml_node_struct *pxVar1;
  byte endch;
  char cVar2;
  undefined *puVar3;
  bool bVar4;
  xml_encoding xVar5;
  undefined8 in_RAX;
  undefined7 extraout_var;
  xml_parse_result *pxVar6;
  size_t sVar7;
  xml_node_struct *pxVar8;
  long lVar9;
  xml_attribute_struct *pxVar10;
  xml_node_struct *pxVar11;
  char_t *pcVar12;
  xml_node_struct *pxVar13;
  xml_node_struct **ppxVar14;
  byte bVar15;
  byte bVar16;
  ushort uVar17;
  uint uVar18;
  uint uVar19;
  char *__function;
  ulong uVar20;
  byte *pbVar21;
  byte *pbVar22;
  uint uVar23;
  ushort *puVar24;
  ushort *puVar25;
  long lVar26;
  ulong uVar27;
  xml_allocator *alloc;
  ushort uVar28;
  long lVar29;
  xml_parse_status xVar30;
  xml_parse_status xVar31;
  size_t sVar32;
  xml_node_struct *pxVar33;
  void *pvVar34;
  xml_node_struct *pxVar35;
  size_t length;
  char_t *buffer;
  xml_node_struct *local_d0;
  xml_node_struct *local_a0;
  xml_node_struct *local_98;
  xml_node_struct *local_90;
  xml_node_struct *local_88;
  uint local_7c;
  gap local_78;
  xml_node_struct *local_60;
  xml_node_struct **local_58;
  code *local_50;
  code *local_48;
  xml_node_struct *local_40;
  xml_node_struct *local_38;
  
  if (size != 0 && contents == (void *)0x0) {
    __return_storage_ptr__->encoding = encoding_auto;
    __return_storage_ptr__->status = status_io_error;
    __return_storage_ptr__->offset = 0;
    return (xml_parse_result *)CONCAT71((int7)((ulong)in_RAX >> 8),contents != (void *)0x0);
  }
  local_88 = root;
  xVar5 = get_buffer_encoding(encoding,contents,size);
  puVar3 = (anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate;
  pvVar34 = (void *)0x0;
  if (own) {
    pvVar34 = contents;
  }
  local_98 = (xml_node_struct *)0x0;
  local_a0 = (xml_node_struct *)0x0;
  if (xVar5 == encoding_utf8) goto LAB_00130b45;
  if ((xVar5 & ~encoding_utf8) == encoding_utf16_le) {
    uVar27 = size >> 1;
    lVar9 = 0;
    if (xVar5 == encoding_utf16_le) {
      uVar20 = uVar27;
      puVar24 = (ushort *)contents;
      if (1 < size) {
        do {
          uVar17 = *puVar24;
          if (uVar17 < 0xd800) {
            lVar26 = 3 - (ulong)(uVar17 < 0x800);
            if (uVar17 < 0x80) {
              lVar26 = 1;
            }
            lVar9 = lVar9 + lVar26;
LAB_00130d0b:
            puVar25 = puVar24 + 1;
            lVar26 = -1;
          }
          else {
            if ((~uVar17 & 0xe000) == 0) {
              lVar9 = lVar9 + 3;
              goto LAB_00130d0b;
            }
            puVar25 = puVar24 + 1;
            lVar26 = -1;
            if (((uVar20 != 1) && ((uVar17 & 0xfc00) == 0xd800)) && ((*puVar25 & 0xfc00) == 0xdc00))
            {
              lVar9 = lVar9 + 4;
              puVar25 = puVar24 + 2;
              lVar26 = -2;
            }
          }
          uVar20 = uVar20 + lVar26;
          puVar24 = puVar25;
        } while (uVar20 != 0);
      }
      local_d0 = (xml_node_struct *)(lVar9 + 1);
      pxVar13 = (xml_node_struct *)
                (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                          allocate)();
      if (pxVar13 == (xml_node_struct *)0x0) goto LAB_00130b6b;
      pxVar8 = pxVar13;
      puVar24 = (ushort *)contents;
      if (1 < size) {
        do {
          uVar17 = *puVar24;
          uVar23 = (uint)uVar17;
          if ((uVar17 < 0xd800) || ((~uVar17 & 0xe000) == 0)) {
            pxVar8 = (xml_node_struct *)utf8_writer::low((value_type)pxVar8,uVar23);
            puVar25 = puVar24 + 1;
            lVar26 = -1;
          }
          else {
            puVar25 = puVar24 + 1;
            lVar26 = -1;
            if ((uVar27 != 1) && ((uVar23 & 0xfc00) == 0xd800)) {
              uVar17 = *puVar25;
              if ((uVar17 & 0xfc00) == 0xdc00) {
                uVar18 = (uVar23 << 10 & 0xffc00) + 0x10000;
                *(byte *)&pxVar8->header = (byte)(uVar18 >> 0x12) | 0xf0;
                *(byte *)((long)&pxVar8->header + 1) = (byte)(uVar18 >> 0xc) & 0x3f | 0x80;
                *(byte *)((long)&pxVar8->header + 2) =
                     (byte)((uVar17 & 0x3c0 | uVar23 << 10) >> 6) & 0x3f | 0x80;
                *(byte *)((long)&pxVar8->header + 3) = (byte)uVar17 & 0x3f | 0x80;
                pxVar8 = (xml_node_struct *)((long)&pxVar8->header + 4);
                puVar25 = puVar24 + 2;
                lVar26 = -2;
              }
            }
          }
          uVar27 = uVar27 + lVar26;
          puVar24 = puVar25;
        } while (uVar27 != 0);
      }
      if (pxVar8 != (xml_node_struct *)((long)&pxVar13->header + lVar9)) {
        __function = 
        "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf16_decoder<pugi::impl::(anonymous namespace)::opt_false>]"
        ;
LAB_00132359:
        __assert_fail("oend == obegin + length",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                      ,0x89f,__function);
      }
    }
    else {
      uVar20 = uVar27;
      puVar24 = (ushort *)contents;
      if (1 < size) {
        do {
          uVar17 = *puVar24 << 8;
          uVar28 = uVar17 | *puVar24 >> 8;
          if (uVar28 < 0xd800) {
            lVar26 = 3 - (ulong)(uVar28 < 0x800);
            if (uVar28 < 0x80) {
              lVar26 = 1;
            }
            lVar9 = lVar9 + lVar26;
LAB_00130dcd:
            puVar25 = puVar24 + 1;
            lVar26 = -1;
          }
          else {
            if ((~uVar28 & 0xe000) == 0) {
              lVar9 = lVar9 + 3;
              goto LAB_00130dcd;
            }
            puVar25 = puVar24 + 1;
            lVar26 = -1;
            if (((uVar20 != 1) && ((uVar17 & 0xfc00) == 0xd800)) && ((*puVar25 & 0xfc) == 0xdc)) {
              lVar9 = lVar9 + 4;
              puVar25 = puVar24 + 2;
              lVar26 = -2;
            }
          }
          uVar20 = uVar20 + lVar26;
          puVar24 = puVar25;
        } while (uVar20 != 0);
      }
      local_d0 = (xml_node_struct *)(lVar9 + 1);
      pxVar13 = (xml_node_struct *)
                (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                          allocate)();
      if (pxVar13 == (xml_node_struct *)0x0) goto LAB_00130b6b;
      pxVar8 = pxVar13;
      puVar24 = (ushort *)contents;
      if (1 < size) {
        do {
          uVar17 = *puVar24 << 8 | *puVar24 >> 8;
          uVar23 = (uint)uVar17;
          if ((uVar17 < 0xd800) || ((~uVar17 & 0xe000) == 0)) {
            pxVar8 = (xml_node_struct *)utf8_writer::low((value_type)pxVar8,uVar23);
            puVar25 = puVar24 + 1;
            lVar26 = -1;
          }
          else {
            puVar25 = puVar24 + 1;
            lVar26 = -1;
            if ((uVar27 != 1) && ((uVar23 & 0xfc00) == 0xd800)) {
              uVar17 = *puVar25;
              uVar18 = (uint)(ushort)(uVar17 << 8 | uVar17 >> 8);
              if ((uVar18 & 0xfc00) == 0xdc00) {
                uVar19 = (uVar23 << 10 & 0xffc00) + 0x10000;
                *(byte *)&pxVar8->header = (byte)(uVar19 >> 0x12) | 0xf0;
                *(byte *)((long)&pxVar8->header + 1) = (byte)(uVar19 >> 0xc) & 0x3f | 0x80;
                *(byte *)((long)&pxVar8->header + 2) =
                     (byte)((uVar18 & 0x3c0 | uVar23 << 10) >> 6) & 0x3f | 0x80;
                *(byte *)((long)&pxVar8->header + 3) = (byte)(uVar17 >> 8) & 0x3f | 0x80;
                pxVar8 = (xml_node_struct *)((long)&pxVar8->header + 4);
                puVar25 = puVar24 + 2;
                lVar26 = -2;
              }
            }
          }
          uVar27 = uVar27 + lVar26;
          puVar24 = puVar25;
        } while (uVar27 != 0);
      }
      if (pxVar8 != (xml_node_struct *)((long)&pxVar13->header + lVar9)) {
        __function = 
        "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf16_decoder<pugi::impl::(anonymous namespace)::opt_true>]"
        ;
        goto LAB_00132359;
      }
    }
LAB_001311de:
    *(byte *)&pxVar8->header = 0;
    local_98 = pxVar13;
LAB_001311e6:
    local_a0 = local_d0;
    local_90 = local_d0;
  }
  else {
    if (xVar5 - encoding_utf32_le < 2) {
      uVar27 = size >> 2;
      if (xVar5 == encoding_utf32_le) {
        if (size < 4) {
          lVar9 = 0;
        }
        else {
          uVar20 = 0;
          lVar9 = 0;
          do {
            uVar23 = *(uint *)((long)contents + uVar20 * 4);
            if (uVar23 < 0x10000) {
              lVar26 = 3 - (ulong)(uVar23 < 0x800);
              if (uVar23 < 0x80) {
                lVar26 = 1;
              }
              lVar9 = lVar9 + lVar26;
            }
            else {
              lVar9 = lVar9 + 4;
            }
            uVar20 = uVar20 + 1;
          } while (uVar27 != uVar20);
        }
        local_d0 = (xml_node_struct *)(lVar9 + 1);
        pxVar13 = (xml_node_struct *)
                  (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                            allocate)();
        if (pxVar13 == (xml_node_struct *)0x0) goto LAB_00130b6b;
        pxVar8 = pxVar13;
        if (3 < size) {
          uVar20 = 0;
          do {
            uVar23 = *(uint *)((long)contents + uVar20 * 4);
            if (uVar23 < 0x10000) {
              pxVar8 = (xml_node_struct *)utf8_writer::low((value_type)pxVar8,uVar23);
            }
            else {
              *(byte *)&pxVar8->header = (byte)(uVar23 >> 0x12) | 0xf0;
              *(byte *)((long)&pxVar8->header + 1) = (byte)(uVar23 >> 0xc) & 0x3f | 0x80;
              *(byte *)((long)&pxVar8->header + 2) = (byte)(uVar23 >> 6) & 0x3f | 0x80;
              *(byte *)((long)&pxVar8->header + 3) = (byte)uVar23 & 0x3f | 0x80;
              pxVar8 = (xml_node_struct *)((long)&pxVar8->header + 4);
            }
            uVar20 = uVar20 + 1;
          } while (uVar27 != uVar20);
        }
        if (pxVar8 != (xml_node_struct *)((long)&pxVar13->header + lVar9)) {
          __function = 
          "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf32_decoder<pugi::impl::(anonymous namespace)::opt_false>]"
          ;
          goto LAB_00132359;
        }
      }
      else {
        if (size < 4) {
          lVar9 = 0;
        }
        else {
          uVar20 = 0;
          lVar9 = 0;
          do {
            uVar23 = *(uint *)((long)contents + uVar20 * 4);
            uVar23 = uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8 |
                     uVar23 << 0x18;
            if (uVar23 < 0x10000) {
              lVar26 = 3 - (ulong)(uVar23 < 0x800);
              if (uVar23 < 0x80) {
                lVar26 = 1;
              }
              lVar9 = lVar9 + lVar26;
            }
            else {
              lVar9 = lVar9 + 4;
            }
            uVar20 = uVar20 + 1;
          } while (uVar27 != uVar20);
        }
        local_d0 = (xml_node_struct *)(lVar9 + 1);
        pxVar13 = (xml_node_struct *)
                  (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                            allocate)();
        if (pxVar13 == (xml_node_struct *)0x0) goto LAB_00130b6b;
        pxVar8 = pxVar13;
        if (3 < size) {
          uVar20 = 0;
          do {
            uVar23 = *(uint *)((long)contents + uVar20 * 4);
            uVar18 = uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8 |
                     uVar23 << 0x18;
            if (uVar18 < 0x10000) {
              pxVar8 = (xml_node_struct *)utf8_writer::low((value_type)pxVar8,uVar18);
            }
            else {
              *(byte *)&pxVar8->header = (byte)(uVar18 >> 0x12) | 0xf0;
              *(byte *)((long)&pxVar8->header + 1) = (byte)(uVar18 >> 0xc) & 0x3f | 0x80;
              *(byte *)((long)&pxVar8->header + 2) = (byte)(uVar18 >> 6) & 0x3f | 0x80;
              *(byte *)((long)&pxVar8->header + 3) = (byte)(uVar23 >> 0x18) & 0x3f | 0x80;
              pxVar8 = (xml_node_struct *)((long)&pxVar8->header + 4);
            }
            uVar20 = uVar20 + 1;
          } while (uVar27 != uVar20);
        }
        if (pxVar8 != (xml_node_struct *)((long)&pxVar13->header + lVar9)) {
          __function = 
          "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf32_decoder<pugi::impl::(anonymous namespace)::opt_true>]"
          ;
          goto LAB_00132359;
        }
      }
      goto LAB_001311de;
    }
    if (xVar5 != encoding_latin1) {
      __assert_fail("false && \"Invalid encoding\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                    ,0x8f4,
                    "bool pugi::impl::(anonymous namespace)::convert_buffer(char_t *&, size_t &, xml_encoding, const void *, size_t, bool)"
                   );
    }
    sVar32 = 0;
    if (size == 0) {
LAB_00130e37:
      if (size == sVar32) goto LAB_00130b45;
      if (size == sVar32) {
        lVar9 = 0;
      }
      else {
        lVar9 = 0;
        sVar7 = sVar32;
        do {
          lVar9 = (lVar9 - (ulong)(-1 < *(char *)((long)contents + sVar7))) + 2;
          sVar7 = sVar7 + 1;
        } while (size != sVar7);
      }
      local_d0 = (xml_node_struct *)(sVar32 + lVar9 + 1);
      pxVar13 = (xml_node_struct *)
                (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                          allocate)();
      if (pxVar13 == (xml_node_struct *)0x0) goto LAB_00130b6b;
      lVar9 = lVar9 + sVar32;
      memcpy(pxVar13,contents,sVar32);
      pbVar22 = (byte *)((long)&pxVar13->header + sVar32);
      for (; size != sVar32; sVar32 = sVar32 + 1) {
        pbVar22 = utf8_writer::low(pbVar22,(uint)*(byte *)((long)contents + sVar32));
      }
      if (pbVar22 != (byte *)((long)&pxVar13->header + lVar9)) {
        __assert_fail("oend == obegin + length",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                      ,0x8cd,
                      "bool pugi::impl::(anonymous namespace)::convert_buffer_latin1(char_t *&, size_t &, const void *, size_t, bool)"
                     );
      }
      *pbVar22 = 0;
      local_98 = pxVar13;
      goto LAB_001311e6;
    }
    do {
      if (*(char *)((long)contents + sVar32) < '\0') {
        if (size < sVar32) {
          __assert_fail("prefix_length <= data_length",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                        ,0x8b8,
                        "bool pugi::impl::(anonymous namespace)::convert_buffer_latin1(char_t *&, size_t &, const void *, size_t, bool)"
                       );
        }
        goto LAB_00130e37;
      }
      sVar32 = sVar32 + 1;
    } while (size != sVar32);
LAB_00130b45:
    bVar4 = get_mutable_buffer((char_t **)&local_98,(size_t *)&local_a0,contents,size,is_mutable);
    local_90 = (xml_node_struct *)CONCAT71(extraout_var,bVar4);
    if (!bVar4) {
LAB_00130b6b:
      __return_storage_ptr__->encoding = encoding_auto;
      __return_storage_ptr__->status = status_out_of_memory;
      __return_storage_ptr__->offset = 0;
      if (pvVar34 == (void *)0x0) {
        return __return_storage_ptr__;
      }
      pxVar6 = (xml_parse_result *)(*(code *)puVar3)(pvVar34);
      return pxVar6;
    }
  }
  pxVar13 = local_88;
  pxVar8 = local_98;
  if (own) {
    if (contents != (void *)0x0 && local_98 != (xml_node_struct *)contents) {
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                (contents);
    }
LAB_00131247:
    *out_buffer = (char_t *)pxVar8;
    local_90 = (xml_node_struct *)out_buffer;
  }
  else if (local_98 != (xml_node_struct *)contents) goto LAB_00131247;
  doc->buffer = (char_t *)pxVar8;
  if (local_a0 != (xml_node_struct *)0x0) {
    if (pxVar13->first_child == (xml_node_struct *)0x0) {
      local_60 = (xml_node_struct *)0x0;
    }
    else {
      local_60 = pxVar13->first_child->prev_sibling_c;
    }
    endch = ((undefined1 *)((long)&pxVar8[-1].first_attribute + 7))[(long)local_a0];
    ((undefined1 *)((long)&pxVar8[-1].first_attribute + 7))[(long)local_a0] = 0;
    pxVar35 = pxVar8;
    if (((byte)pxVar8->header == 0xef) && (*(byte *)((long)&pxVar8->header + 1) == 0xbb)) {
      pxVar35 = (xml_node_struct *)
                ((long)&pxVar8->header + (ulong)(*(byte *)((long)&pxVar8->header + 2) == 0xbf) * 3);
    }
    local_38 = pxVar8;
    local_58 = &pxVar13->first_child;
    alloc = &doc->super_xml_allocator;
    local_40 = local_a0;
    local_90 = (xml_node_struct *)((long)&local_a0[-1].first_attribute + 7);
    local_48 = *(code **)((long)&PTR_parse_simple_00240078 + (ulong)(options >> 1 & 0x78));
    local_50 = (code *)(&PTR_parse_002400f8)[options >> 9 & 4 | options >> 4 & 3];
    local_7c = options & 0x22;
    local_d0._0_1_ = endch ^ 0x3e;
LAB_00131374:
    do {
      uVar27 = (ulong)(byte)pxVar35->header;
      while( true ) {
        pxVar8 = pxVar35;
        if ((char)uVar27 == '\0') goto LAB_00131fdc;
        if ((int)uVar27 == 0x3c) goto LAB_00131400;
        bVar15 = (anonymous_namespace)::chartype_table[uVar27];
        pxVar35 = pxVar8;
        while ((bVar15 & 8) != 0) {
          uVar27 = (ulong)*(byte *)((long)&pxVar35->header + 1);
          pxVar35 = (xml_node_struct *)((long)&pxVar35->header + 1);
          bVar15 = (anonymous_namespace)::chartype_table[uVar27];
        }
        if (((char)uVar27 != '<') && (uVar27 != 0)) break;
        if (pxVar8 == pxVar35) {
          __assert_fail("mark != s",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                        ,0xd74,
                        "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_tree(char_t *, xml_node_struct *, unsigned int, char_t)"
                       );
        }
        if (((options >> 0xb & 1) == 0 && (options & 0x408) != 0) &&
           (((options >> 10 & 1) == 0 ||
            ((((char)uVar27 == '<' && (*(byte *)((long)&pxVar35->header + 1) == 0x2f)) &&
             (pxVar13->first_child == (xml_node_struct *)0x0)))))) break;
      }
      if ((options >> 0xb & 1) != 0) {
        pxVar8 = pxVar35;
      }
      if (((options >> 0xc & 1) == 0) && (pxVar13->parent == (xml_node_struct *)0x0)) {
        while( true ) {
          bVar15 = (byte)pxVar8->header;
          if (bVar15 == 0) goto LAB_00131fdc;
          if (bVar15 == 0x3c) break;
          pxVar8 = (xml_node_struct *)((long)&pxVar8->header + 1);
        }
LAB_00131400:
        bVar15 = *(byte *)((long)&pxVar8->header + 1);
        pxVar8 = (xml_node_struct *)((long)&pxVar8->header + 1);
      }
      else {
        if ((((options >> 0xd & 1) == 0) ||
            ((pxVar13->parent == (xml_node_struct *)0x0 ||
             (pxVar13->first_child != (xml_node_struct *)0x0)))) ||
           (pxVar13->value != (char_t *)0x0)) {
          pxVar13 = append_new_node(pxVar13,alloc,node_pcdata);
          if (pxVar13 == (xml_node_struct *)0x0) {
            pxVar11 = pxVar8;
            xVar31 = status_out_of_memory;
            goto LAB_001321ac;
          }
          pxVar13->value = (char_t *)pxVar8;
          pxVar13 = pxVar13->parent;
        }
        else {
          pxVar13->value = (char_t *)pxVar8;
        }
        pxVar8 = (xml_node_struct *)(*local_50)(pxVar8);
        bVar15 = (byte)pxVar8->header;
        if (bVar15 == 0) {
LAB_00131fdc:
          pxVar11 = (xml_node_struct *)0x0;
          if (pxVar13 != local_88) {
            pxVar11 = pxVar8;
          }
          xVar31 = status_end_element_mismatch;
          if (pxVar13 == local_88) {
            xVar31 = status_ok;
          }
          goto LAB_001321ac;
        }
      }
      if ((char)(anonymous_namespace)::chartype_table[bVar15] < '\0') {
        pxVar13 = append_new_node(pxVar13,alloc,node_element);
        if (pxVar13 == (xml_node_struct *)0x0) goto LAB_001320c9;
        pxVar13->name = (char_t *)pxVar8;
        pxVar8 = (xml_node_struct *)((long)&pxVar8->header + 1);
        do {
          pxVar11 = pxVar8;
          uVar27 = (ulong)*(byte *)((long)&pxVar11[-1].first_attribute + 7);
          bVar15 = (anonymous_namespace)::chartype_table[uVar27];
          if ((bVar15 & 0x40) == 0) {
            pxVar11 = (xml_node_struct *)((long)&pxVar11[-1].first_attribute + 7);
            goto LAB_00131881;
          }
          uVar27 = (ulong)(byte)pxVar11->header;
          bVar15 = (anonymous_namespace)::chartype_table[uVar27];
          if ((bVar15 & 0x40) == 0) goto LAB_00131881;
          uVar27 = (ulong)*(byte *)((long)&pxVar11->header + 1);
          bVar15 = (anonymous_namespace)::chartype_table[uVar27];
          if ((bVar15 & 0x40) == 0) {
            pxVar11 = (xml_node_struct *)((long)&pxVar11->header + 1);
            goto LAB_00131881;
          }
          uVar27 = (ulong)*(byte *)((long)&pxVar11->header + 2);
          bVar15 = (anonymous_namespace)::chartype_table[uVar27];
          pxVar8 = (xml_node_struct *)((long)&pxVar11->header + 4);
        } while ((bVar15 & 0x40) != 0);
        pxVar11 = (xml_node_struct *)((long)&pxVar11->header + 2);
LAB_00131881:
        *(byte *)&pxVar11->header = 0;
        pxVar35 = (xml_node_struct *)((long)&pxVar11->header + 1);
        if ((char)uVar27 != '>') {
          if ((bVar15 & 8) != 0) goto LAB_00131c7a;
          xVar31 = status_bad_start_element;
          if ((char)uVar27 == '\0') {
            pxVar35 = pxVar11;
            if (endch != 0x3e) goto LAB_001321ac;
          }
          else {
            pxVar11 = pxVar35;
            if ((int)uVar27 != 0x2f) goto LAB_001321ac;
            bVar15 = (byte)pxVar35->header;
            if ((bVar15 != 0x3e) && ((byte)local_d0 != 0 || bVar15 != 0)) goto LAB_001321ac;
            pxVar13 = pxVar13->parent;
            pxVar35 = (xml_node_struct *)((long)&pxVar35->header + (ulong)(bVar15 == 0x3e));
          }
        }
        goto LAB_00131374;
      }
      if (bVar15 == 0x21) {
        bVar15 = *(byte *)((long)&pxVar8->header + 1);
        if (bVar15 == 0x5b) {
          if (*(byte *)((long)&pxVar8->header + 2) == 0x43) {
            if (*(byte *)((long)&pxVar8->header + 3) != 0x44) {
              pxVar11 = (xml_node_struct *)((long)&pxVar8->header + 3);
              goto LAB_001321a3;
            }
            if (*(byte *)((long)&pxVar8->header + 4) != 0x41) {
              pxVar11 = (xml_node_struct *)((long)&pxVar8->header + 4);
              goto LAB_001321a3;
            }
            if (*(byte *)((long)&pxVar8->header + 5) != 0x54) {
              pxVar11 = (xml_node_struct *)((long)&pxVar8->header + 5);
              goto LAB_001321a3;
            }
            if (*(byte *)((long)&pxVar8->header + 6) != 0x41) {
              pxVar11 = (xml_node_struct *)((long)&pxVar8->header + 6);
              goto LAB_001321a3;
            }
            if (*(byte *)((long)&pxVar8->header + 7) != 0x5b) {
              pxVar11 = (xml_node_struct *)((long)&pxVar8->header + 7);
              goto LAB_001321a3;
            }
            pxVar11 = (xml_node_struct *)&pxVar8->name;
            if ((options & 4) == 0) {
              do {
                if (*(byte *)&pxVar11->header == 0x5d) {
                  if (*(byte *)((long)&pxVar11->header + 1) == 0x5d) {
                    bVar15 = *(byte *)((long)&pxVar11->header + 2);
                    if ((bVar15 == 0x3e) || ((endch ^ 0x3e) == 0 && bVar15 == 0)) goto LAB_00131ef6;
                  }
                }
                else if (*(byte *)&pxVar11->header == 0) goto LAB_001321a3;
                pxVar11 = (xml_node_struct *)((long)&pxVar11->header + 1);
              } while( true );
            }
            pxVar35 = append_new_node(pxVar13,alloc,node_cdata);
            pxVar8 = pxVar11;
            if (pxVar35 == (xml_node_struct *)0x0) goto LAB_001320c9;
            pxVar35->value = (char_t *)pxVar11;
            if ((options & 0x20) == 0) {
              do {
                if (*(byte *)&pxVar11->header == 0x5d) {
                  if (*(byte *)((long)&pxVar11->header + 1) == 0x5d) {
                    bVar15 = *(byte *)((long)&pxVar11->header + 2);
                    if ((bVar15 == 0x3e) || ((byte)local_d0 == 0 && bVar15 == 0)) goto LAB_00131ef1;
                  }
                }
                else if (*(byte *)&pxVar11->header == 0) goto LAB_001321a3;
                pxVar11 = (xml_node_struct *)((long)&pxVar11->header + 1);
              } while( true );
            }
            pbVar22 = (byte *)strconv_cdata((char_t *)pxVar11,endch);
            if (pbVar22 != (byte *)0x0) goto LAB_00131ef9;
            pxVar11 = (xml_node_struct *)pxVar35->value;
            xVar31 = status_bad_cdata;
          }
          else {
            pxVar11 = (xml_node_struct *)((long)&pxVar8->header + 2);
LAB_001321a3:
            xVar31 = status_bad_cdata;
          }
        }
        else {
          pxVar35 = (xml_node_struct *)((long)&pxVar8->header + 1);
          pxVar11 = pxVar35;
          if (bVar15 == 0x44) {
            xVar31 = status_unrecognized_tag;
            if ((((*(byte *)((long)&pxVar8->header + 2) == 0x4f) &&
                 (*(byte *)((long)&pxVar8->header + 3) == 0x43)) &&
                (*(byte *)((long)&pxVar8->header + 4) == 0x54)) &&
               ((*(byte *)((long)&pxVar8->header + 5) == 0x59 &&
                (*(byte *)((long)&pxVar8->header + 6) == 0x50)))) {
              bVar15 = *(byte *)((long)&pxVar8->header + 7);
              if ((bVar15 == 0x45) || (endch == 0x45 && bVar15 == 0)) {
                pxVar11 = (xml_node_struct *)((long)&pxVar8[-1].first_attribute + 7);
                xVar31 = status_bad_doctype;
                xVar30 = status_bad_doctype;
                if (pxVar13->parent == (xml_node_struct *)0x0) {
                  bVar15 = (byte)pxVar11->header;
                  if ((bVar15 != 0x3c) && (bVar15 != 0)) {
                    __assert_fail("(s[0] == \'<\' || s[0] == 0) && s[1] == \'!\'",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                                  ,0xbc6,
                                  "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_doctype_group(char_t *, char_t)"
                                 );
                  }
                  bVar15 = 0x44;
                  lVar9 = 0;
LAB_001319de:
                  pxVar11 = pxVar35;
                  xVar31 = xVar30;
                  if (bVar15 < 0x3c) {
                    if ((bVar15 != 0x22) && (bVar15 != 0x27)) {
                      if (bVar15 == 0) goto LAB_00131f31;
LAB_00131abb:
                      pxVar35 = (xml_node_struct *)((long)&pxVar35->header + 1);
                      goto LAB_00131abe;
                    }
                    pxVar35 = (xml_node_struct *)((long)&pxVar35->header + 1);
                    do {
                      pxVar11 = pxVar35;
                      bVar16 = (byte)pxVar11->header;
                      pxVar35 = (xml_node_struct *)((long)&pxVar11->header + 1);
                      if (bVar16 == 0) break;
                    } while (bVar16 != bVar15);
                    if (bVar16 == 0) goto LAB_001321ac;
                  }
                  else {
                    if (bVar15 != 0x3c) {
                      if (bVar15 == 0x3e) {
                        if (lVar9 != 0) {
                          lVar9 = lVar9 + -1;
                          goto LAB_00131abb;
                        }
                        *(byte *)&pxVar35->header = 0;
                        pxVar35 = (xml_node_struct *)((long)&pxVar35->header + 1);
                        goto LAB_00131f4d;
                      }
                      goto LAB_00131abb;
                    }
                    bVar15 = *(byte *)((long)&pxVar35->header + 1);
                    if (bVar15 == 0x3f) {
                      pxVar11 = (xml_node_struct *)((long)&pxVar35->header + 2);
                      do {
                        bVar15 = (byte)pxVar11->header;
                        if (bVar15 == 0x3f) {
                          if (*(byte *)((long)&pxVar11->header + 1) == 0x3e) goto LAB_00131ae8;
                        }
                        else if (bVar15 == 0) goto LAB_001321ac;
                        pxVar11 = (xml_node_struct *)((long)&pxVar11->header + 1);
                      } while( true );
                    }
                    if (bVar15 != 0x21) goto LAB_001321ac;
                    bVar15 = *(byte *)((long)&pxVar35->header + 2);
                    if (bVar15 == 0x2d) {
                      if (*(byte *)((long)&pxVar35->header + 3) == 0x2d) {
                        pxVar11 = (xml_node_struct *)((long)&pxVar35->header + 4);
                        do {
                          bVar15 = (byte)pxVar11->header;
                          if (bVar15 == 0x2d) {
                            if ((*(byte *)((long)&pxVar11->header + 1) == 0x2d) &&
                               (*(byte *)((long)&pxVar11->header + 2) == 0x3e)) goto LAB_00131b2b;
                          }
                          else if (bVar15 == 0) break;
                          pxVar11 = (xml_node_struct *)((long)&pxVar11->header + 1);
                        } while( true );
                      }
                      goto LAB_001321ac;
                    }
                    if (bVar15 == 0x5b) {
                      pxVar35 = (xml_node_struct *)((long)&pxVar35->header + 3);
                      lVar26 = 0;
LAB_00131a65:
                      pxVar35 = (xml_node_struct *)((long)&pxVar35->header + 3);
                      do {
                        cVar2 = *(char *)((long)&pxVar35[-1].first_attribute + 5);
                        if (cVar2 == '<') {
                          if ((*(char *)((long)&pxVar35[-1].first_attribute + 6) == '!') &&
                             (*(char *)((long)&pxVar35[-1].first_attribute + 7) == '[')) {
                            lVar26 = lVar26 + 1;
                            goto LAB_00131a65;
                          }
                        }
                        else if (cVar2 == ']') {
                          if ((*(char *)((long)&pxVar35[-1].first_attribute + 6) == ']') &&
                             (*(char *)((long)&pxVar35[-1].first_attribute + 7) == '>'))
                          goto LAB_00131aa4;
                        }
                        else if (cVar2 == '\0') {
                          pxVar11 = (xml_node_struct *)((long)&pxVar35[-1].first_attribute + 5);
                          goto LAB_001321ac;
                        }
                        pxVar35 = (xml_node_struct *)((long)&pxVar35->header + 1);
                      } while( true );
                    }
                    pxVar35 = (xml_node_struct *)((long)&pxVar35->header + 2);
                    lVar9 = lVar9 + 1;
                  }
                  goto LAB_00131abe;
                }
              }
            }
          }
          else if (bVar15 == 0x2d) {
            if (*(byte *)((long)&pxVar8->header + 2) == 0x2d) {
              pxVar11 = (xml_node_struct *)((long)&pxVar8->header + 3);
              pxVar35 = pxVar13;
              if ((options & 2) == 0) {
LAB_001316b2:
                if (local_7c != 0x22) {
                  do {
                    bVar15 = (byte)pxVar11->header;
                    if (bVar15 == 0x2d) {
                      if (*(byte *)((long)&pxVar11->header + 1) == 0x2d) {
                        bVar15 = *(byte *)((long)&pxVar11->header + 2);
                        if ((bVar15 == 0x3e) || (endch == 0x3e && bVar15 == 0)) goto LAB_00131e70;
                      }
                    }
                    else if (bVar15 == 0) goto LAB_0013217f;
                    pxVar11 = (xml_node_struct *)((long)&pxVar11->header + 1);
                  } while( true );
                }
                local_78.end = (char_t *)0x0;
                local_78.size = 0;
LAB_001316c5:
                do {
                  pxVar8 = pxVar11;
                  sVar32 = local_78.size;
                  bVar15 = (byte)pxVar8->header;
                  if (((anonymous_namespace)::chartype_table[bVar15] & 0x20) == 0) {
                    pxVar11 = (xml_node_struct *)((long)&pxVar8->header + 2);
                    do {
                      pxVar8 = pxVar11;
                      bVar15 = *(byte *)((long)&pxVar8[-1].first_attribute + 7);
                      if (((anonymous_namespace)::chartype_table[bVar15] & 0x20) != 0) {
                        pxVar8 = (xml_node_struct *)((long)&pxVar8[-1].first_attribute + 7);
                        goto LAB_0013171c;
                      }
                      bVar15 = (byte)pxVar8->header;
                      if (((anonymous_namespace)::chartype_table[bVar15] & 0x20) != 0)
                      goto LAB_0013171c;
                      bVar15 = *(byte *)((long)&pxVar8->header + 1);
                      if (((anonymous_namespace)::chartype_table[bVar15] & 0x20) != 0) {
                        pxVar8 = (xml_node_struct *)((long)&pxVar8->header + 1);
                        goto LAB_0013171c;
                      }
                      bVar15 = *(byte *)((long)&pxVar8->header + 2);
                      pxVar11 = (xml_node_struct *)((long)&pxVar8->header + 4);
                    } while (((anonymous_namespace)::chartype_table[bVar15] & 0x20) == 0);
                    pxVar8 = (xml_node_struct *)((long)&pxVar8->header + 2);
                  }
LAB_0013171c:
                  if (bVar15 != 0xd) {
                    if (bVar15 == 0x2d) {
                      if ((*(byte *)((long)&pxVar8->header + 1) == 0x2d) &&
                         ((bVar15 = *(byte *)((long)&pxVar8->header + 2), bVar15 == 0x3e ||
                          (endch == 0x3e && bVar15 == 0)))) goto LAB_00131e8f;
                    }
                    else if (bVar15 == 0) {
                      pxVar11 = (xml_node_struct *)pxVar35->value;
                      xVar31 = status_bad_comment;
                      goto LAB_001321ac;
                    }
                    pxVar11 = (xml_node_struct *)((long)&pxVar8->header + 1);
                    goto LAB_001316c5;
                  }
                  pxVar11 = (xml_node_struct *)((long)&pxVar8->header + 1);
                  *(byte *)&pxVar8->header = 10;
                  if (*(byte *)((long)&pxVar8->header + 1) == 10) {
                    if ((xml_node_struct *)local_78.end != (xml_node_struct *)0x0) {
                      if (pxVar11 < local_78.end) {
                        __assert_fail("s >= end",
                                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                                      ,0x985,
                                      "void pugi::impl::(anonymous namespace)::gap::push(char_t *&, size_t)"
                                     );
                      }
                      memmove((void *)((long)local_78.end - local_78.size),local_78.end,
                              (long)pxVar11 - (long)local_78.end);
                    }
                    local_78.end = (char_t *)((long)&pxVar8->header + 2);
                    local_78.size = sVar32 + 1;
                    pxVar11 = (xml_node_struct *)local_78.end;
                  }
                } while( true );
              }
              pxVar35 = append_new_node(pxVar13,alloc,node_comment);
              pxVar8 = pxVar11;
              if (pxVar35 != (xml_node_struct *)0x0) {
                pxVar35->value = (char_t *)pxVar11;
                goto LAB_001316b2;
              }
              goto LAB_001320c9;
            }
            pxVar11 = (xml_node_struct *)((long)&pxVar8->header + 2);
LAB_0013217f:
            xVar31 = status_bad_comment;
          }
          else if ((endch != 0x2d) || (xVar31 = status_bad_comment, bVar15 != 0)) {
            xVar31 = (uint)(endch == 0x5b && bVar15 == 0) * 3 + status_unrecognized_tag;
          }
        }
        goto LAB_001321ac;
      }
      if (bVar15 == 0x3f) {
        pxVar1 = (xml_node_struct *)((long)&pxVar8->header + 1);
        bVar15 = *(byte *)((long)&pxVar8->header + 1);
        pxVar11 = pxVar1;
        xVar31 = status_bad_pi;
        if (-1 < (char)(anonymous_namespace)::chartype_table[bVar15]) goto LAB_001321ac;
        lVar26 = 4;
        pbVar22 = (byte *)((long)&pxVar8->header + 3);
        lVar9 = 1;
        pxVar33 = (xml_node_struct *)((long)&pxVar8->header + 1);
        do {
          pxVar35 = pxVar33;
          lVar29 = lVar9;
          pbVar21 = pbVar22;
          bVar16 = (byte)pxVar35->header;
          uVar27 = (ulong)bVar16;
          pxVar33 = (xml_node_struct *)((long)&pxVar35->header + 1);
          lVar26 = lVar26 + -1;
          pbVar22 = pbVar21 + 1;
          lVar9 = lVar29 + 1;
        } while (((anonymous_namespace)::chartype_table[uVar27] & 0x40) != 0);
        pxVar11 = pxVar35;
        if (bVar16 != 0) {
          pxVar11 = (xml_node_struct *)((long)&pxVar8->header + lVar29);
          if (((bVar15 & 0xdf) == 0x58) && ((pxVar8->header & 0xdf0000) == 0x4d0000)) {
            bVar4 = (pxVar8->header & 0xdf000000) != 0x4c000000;
            uVar23 = 1;
            if (lVar26 == 0 && !bVar4) {
              uVar23 = 0x100;
            }
            if ((options & uVar23) == 0) {
LAB_00131811:
              do {
                if ((char)uVar27 == '?') {
                  bVar15 = *(byte *)((long)&pxVar35->header + 1);
                  if ((bVar15 == 0x3e) || ((endch ^ 0x3e) == 0 && bVar15 == 0)) goto LAB_00131c46;
                }
                else {
                  pxVar11 = pxVar35;
                  xVar31 = status_bad_pi;
                  if ((int)uVar27 == 0) goto LAB_001321ac;
                  bVar15 = *(byte *)((long)&pxVar35->header + 1);
                }
                uVar27 = (ulong)bVar15;
                pxVar35 = (xml_node_struct *)((long)&pxVar35->header + 1);
              } while( true );
            }
            if (lVar26 != 0 || bVar4) goto LAB_001318df;
            xVar31 = status_bad_pi;
            if (pxVar13->parent != (xml_node_struct *)0x0) goto LAB_001321ac;
            pxVar13 = append_new_node(pxVar13,alloc,node_declaration);
            if (pxVar13 == (xml_node_struct *)0x0) goto LAB_0013212c;
            bVar4 = true;
          }
          else {
            if ((options & 1) == 0) goto LAB_00131811;
LAB_001318df:
            pxVar13 = append_new_node(pxVar13,alloc,node_pi);
            if (pxVar13 == (xml_node_struct *)0x0) {
LAB_0013212c:
              xVar31 = status_out_of_memory;
              goto LAB_001321ac;
            }
            bVar4 = false;
          }
          xVar31 = status_bad_pi;
          pxVar13->name = (char_t *)pxVar1;
          uVar27 = (ulong)(byte)pxVar35->header;
          *(byte *)&pxVar35->header = 0;
          if (uVar27 != 0x3f) {
            pxVar11 = pxVar33;
            if (((anonymous_namespace)::chartype_table[uVar27] & 8) != 0) {
              do {
                pbVar22 = pbVar21;
                uVar27 = (ulong)*(byte *)((long)&pxVar35->header + 1);
                pxVar35 = (xml_node_struct *)((long)&pxVar35->header + 1);
                pbVar21 = pbVar22 + 1;
              } while (((anonymous_namespace)::chartype_table[uVar27] & 8) != 0);
              do {
                if ((char)uVar27 == '?') {
                  bVar15 = *pbVar22;
                  if ((bVar15 == 0x3e) || ((byte)local_d0 == 0 && bVar15 == 0)) goto LAB_00131e39;
                }
                else {
                  if ((int)uVar27 == 0) {
                    pxVar11 = (xml_node_struct *)(pbVar22 + -1);
                    xVar31 = status_bad_pi;
                    goto LAB_001321ac;
                  }
                  bVar15 = *pbVar22;
                }
                uVar27 = (ulong)bVar15;
                pbVar22 = pbVar22 + 1;
              } while( true );
            }
            goto LAB_0013211c;
          }
          bVar15 = (byte)pxVar33->header;
          if ((bVar15 == 0x3e) || ((byte)local_d0 == 0 && bVar15 == 0)) {
            pxVar35 = (xml_node_struct *)((long)&pxVar33->header + (ulong)(bVar15 == 0x3e));
            pxVar13 = pxVar13->parent;
            goto LAB_00131c62;
          }
          pxVar11 = (xml_node_struct *)((long)&pxVar11->header + 1);
          goto LAB_001321ac;
        }
LAB_0013211c:
        xVar31 = status_bad_pi;
        goto LAB_001321ac;
      }
      if (bVar15 != 0x2f) {
        xVar31 = (endch == 0x3f && bVar15 == 0) + status_unrecognized_tag;
        pxVar11 = pxVar8;
        goto LAB_001321ac;
      }
      pxVar11 = (xml_node_struct *)((long)&pxVar8->header + 1);
      pbVar22 = (byte *)pxVar13->name;
      xVar31 = status_end_element_mismatch;
      pxVar8 = pxVar11;
      if (pbVar22 == (byte *)0x0) goto LAB_001321ac;
      while (bVar15 = (byte)pxVar8->header,
            ((anonymous_namespace)::chartype_table[bVar15] & 0x40) != 0) {
        bVar16 = *pbVar22;
        pbVar22 = pbVar22 + 1;
        pxVar8 = (xml_node_struct *)((long)&pxVar8->header + 1);
        if (bVar15 != bVar16) goto LAB_001321ac;
      }
      if (*pbVar22 != 0) {
        if (((bVar15 == 0) && (*pbVar22 == endch)) && (pbVar22[1] == 0)) {
LAB_0013227a:
          pxVar11 = pxVar8;
          xVar31 = status_bad_end_element;
        }
        goto LAB_001321ac;
      }
      pxVar13 = pxVar13->parent;
      pxVar35 = pxVar8;
      do {
        pxVar8 = pxVar35;
        bVar15 = (byte)pxVar8->header;
        pxVar35 = (xml_node_struct *)((long)&pxVar8->header + 1);
      } while (((anonymous_namespace)::chartype_table[bVar15] & 8) != 0);
      if (bVar15 == 0) goto LAB_00131c20;
      if (bVar15 != 0x3e) goto LAB_0013227a;
    } while( true );
  }
  __return_storage_ptr__->status = ~options >> 8 & status_no_document_element;
  __return_storage_ptr__->offset = 0;
LAB_00132260:
  __return_storage_ptr__->encoding = xVar5;
  return (xml_parse_result *)local_90;
LAB_00131ef1:
  *(byte *)&pxVar11->header = 0;
LAB_00131ef6:
  pbVar22 = (byte *)((long)&pxVar11->header + 1);
LAB_00131ef9:
  pxVar35 = (xml_node_struct *)(pbVar22 + (ulong)(pbVar22[1] == 0x3e) + 1);
  goto LAB_00131374;
LAB_00131ae8:
  pxVar35 = (xml_node_struct *)((long)&pxVar11->header + 2);
  goto LAB_00131abe;
LAB_00131b2b:
  pxVar35 = (xml_node_struct *)((long)&pxVar11->header + 3);
LAB_00131abe:
  bVar15 = (byte)pxVar35->header;
  goto LAB_001319de;
LAB_00131aa4:
  if (lVar26 != 0) {
    lVar26 = lVar26 + -1;
    goto LAB_00131a65;
  }
  goto LAB_00131abe;
LAB_00131f31:
  if ((endch != 0x3e) || (lVar9 != 0)) goto LAB_001321ac;
LAB_00131f4d:
  if ((options >> 9 & 1) != 0) {
    pbVar22 = (byte *)((long)&pxVar8->header + 7);
    do {
      pbVar21 = pbVar22 + 1;
      pbVar22 = pbVar22 + 1;
    } while (((anonymous_namespace)::chartype_table[*pbVar21] & 8) != 0);
    pxVar11 = append_new_node(pxVar13,alloc,node_doctype);
    pxVar8 = pxVar35;
    if (pxVar11 == (xml_node_struct *)0x0) {
LAB_001320c9:
      pxVar11 = pxVar8;
      xVar31 = status_out_of_memory;
      goto LAB_001321ac;
    }
    pxVar11->value = (char_t *)pbVar22;
  }
  goto LAB_00131374;
LAB_00131e70:
  if ((options & 2) != 0) {
    *(byte *)&pxVar11->header = 0;
  }
  pxVar35 = (xml_node_struct *)((long)&pxVar11->header + (ulong)(bVar15 == 0x3e) + 2);
  goto LAB_00131374;
LAB_00131e8f:
  pcVar12 = gap::flush(&local_78,(char_t *)pxVar8);
  *pcVar12 = '\0';
  pxVar35 = (xml_node_struct *)
            ((long)&pxVar8->header + (ulong)(*(byte *)((long)&pxVar8->header + 2) == 0x3e) + 2);
  goto LAB_00131374;
LAB_00131c46:
  pxVar35 = (xml_node_struct *)((long)&pxVar35->header + (ulong)(bVar15 == 0x3e) + 1);
  goto LAB_00131c62;
LAB_00131e39:
  if (bVar4) {
    pbVar22[-1] = 0x2f;
    goto LAB_00131c6b;
  }
  pxVar13->value = (char_t *)pxVar35;
  pxVar13 = pxVar13->parent;
  pbVar22[-1] = 0;
  pxVar35 = (xml_node_struct *)(pbVar22 + (*pbVar22 == 0x3e));
LAB_00131c62:
  if (pxVar13 == (xml_node_struct *)0x0) {
    __assert_fail("cursor",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                  ,0xd60,
                  "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_tree(char_t *, xml_node_struct *, unsigned int, char_t)"
                 );
  }
LAB_00131c6b:
  if ((pxVar13->header & 0xf) == 7) {
LAB_00131c7a:
    while( true ) {
      do {
        pxVar11 = pxVar35;
        bVar15 = (byte)pxVar11->header;
        pxVar35 = (xml_node_struct *)((long)&pxVar11->header + 1);
      } while (((anonymous_namespace)::chartype_table[bVar15] & 8) != 0);
      if (-1 < (char)(anonymous_namespace)::chartype_table[bVar15]) break;
      pxVar10 = append_new_attribute(pxVar13,alloc);
      if (pxVar10 == (xml_attribute_struct *)0x0) {
        xVar31 = status_out_of_memory;
        goto LAB_001321ac;
      }
      pxVar10->name = (char_t *)pxVar11;
      pxVar8 = (xml_node_struct *)((long)&pxVar11->header + 1);
      do {
        pxVar11 = pxVar8;
        bVar15 = *(byte *)((long)&pxVar11[-1].first_attribute + 7);
        bVar16 = (anonymous_namespace)::chartype_table[bVar15];
        if ((bVar16 & 0x40) == 0) {
          pxVar11 = (xml_node_struct *)((long)&pxVar11[-1].first_attribute + 7);
          goto LAB_00131cfd;
        }
        bVar15 = (byte)pxVar11->header;
        bVar16 = (anonymous_namespace)::chartype_table[bVar15];
        if ((bVar16 & 0x40) == 0) goto LAB_00131cfd;
        bVar15 = *(byte *)((long)&pxVar11->header + 1);
        bVar16 = (anonymous_namespace)::chartype_table[bVar15];
        if ((bVar16 & 0x40) == 0) {
          pxVar11 = (xml_node_struct *)((long)&pxVar11->header + 1);
          goto LAB_00131cfd;
        }
        bVar15 = *(byte *)((long)&pxVar11->header + 2);
        bVar16 = (anonymous_namespace)::chartype_table[bVar15];
        pxVar8 = (xml_node_struct *)((long)&pxVar11->header + 4);
      } while ((bVar16 & 0x40) != 0);
      pxVar11 = (xml_node_struct *)((long)&pxVar11->header + 2);
LAB_00131cfd:
      *(byte *)&pxVar11->header = 0;
      while (pxVar11 = (xml_node_struct *)((long)&pxVar11->header + 1), (bVar16 & 8) != 0) {
        bVar15 = (byte)pxVar11->header;
        bVar16 = (anonymous_namespace)::chartype_table[bVar15];
      }
      xVar31 = status_bad_attribute;
      if (bVar15 != 0x3d) goto LAB_001321ac;
      do {
        pxVar8 = pxVar11;
        bVar15 = (byte)pxVar8->header;
        pxVar35 = (xml_node_struct *)((long)&pxVar8->header + 1);
        pxVar11 = pxVar35;
      } while (((anonymous_namespace)::chartype_table[bVar15] & 8) != 0);
      if ((bVar15 != 0x22) && (pxVar11 = pxVar8, bVar15 != 0x27)) goto LAB_001321ac;
      pxVar10->value = (char_t *)pxVar35;
      pxVar11 = (xml_node_struct *)(*local_48)(pxVar35,(int)(char)bVar15);
      if (pxVar11 == (xml_node_struct *)0x0) {
        pxVar11 = (xml_node_struct *)pxVar10->value;
        xVar31 = status_bad_attribute;
        goto LAB_001321ac;
      }
      pxVar35 = pxVar11;
      xVar31 = status_bad_attribute;
      if ((char)(anonymous_namespace)::chartype_table[(byte)pxVar11->header] < '\0')
      goto LAB_001321ac;
    }
    if (bVar15 != 0x3e) {
      if (bVar15 == 0x2f) {
        bVar15 = (byte)pxVar35->header;
        if (bVar15 == 0x3e) {
          pxVar13 = pxVar13->parent;
          pxVar35 = (xml_node_struct *)((long)&pxVar11->header + 2);
        }
        else {
          pxVar11 = pxVar35;
          xVar31 = status_bad_start_element;
          if ((endch != 0x3e) || (bVar15 != 0)) goto LAB_001321ac;
          pxVar13 = pxVar13->parent;
        }
      }
      else {
        xVar31 = status_bad_start_element;
        if ((endch != 0x3e) || (pxVar35 = pxVar11, xVar31 = status_bad_start_element, bVar15 != 0))
        goto LAB_001321ac;
      }
    }
  }
  goto LAB_00131374;
LAB_00131c20:
  pxVar35 = pxVar8;
  if (endch != 0x3e) goto LAB_00132290;
  goto LAB_00131374;
LAB_00132290:
  xVar31 = status_bad_end_element;
  pxVar11 = pxVar8;
LAB_001321ac:
  pxVar13 = (xml_node_struct *)((long)pxVar11 - (long)local_38);
  if (pxVar11 != (xml_node_struct *)0x0) {
    pxVar11 = pxVar13;
  }
  if (((long)pxVar11 < 0) || (local_40 < pxVar11)) {
    __assert_fail("result.offset >= 0 && static_cast<size_t>(result.offset) <= length",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                  ,0xdd9,
                  "static xml_parse_result pugi::impl::(anonymous namespace)::xml_parser::parse(char_t *, size_t, xml_document_struct *, xml_node_struct *, unsigned int)"
                 );
  }
  if (xVar31 == status_ok) {
    if (endch == 0x3c) {
      __return_storage_ptr__->status = status_unrecognized_tag;
    }
    else {
      pxVar8 = pxVar11;
      if ((options >> 0xc & 1) != 0) goto LAB_00132243;
      ppxVar14 = &local_60->next_sibling;
      if (local_60 == (xml_node_struct *)0x0) {
        ppxVar14 = local_58;
      }
      for (pxVar13 = *ppxVar14; pxVar13 != (xml_node_struct *)0x0; pxVar13 = pxVar13->next_sibling)
      {
        if ((pxVar13->header & 0xf) == 2) goto LAB_00132243;
      }
      __return_storage_ptr__->status = status_no_document_element;
    }
    __return_storage_ptr__->offset = (ptrdiff_t)local_90;
  }
  else {
    if (pxVar11 == (xml_node_struct *)0x0) {
      pxVar8 = (xml_node_struct *)0x0;
    }
    else {
      pxVar8 = (xml_node_struct *)((long)&pxVar11[-1].first_attribute + 7);
      if (endch != 0) {
        pxVar8 = pxVar13;
      }
      if (pxVar11 != local_90) {
        pxVar8 = pxVar13;
      }
    }
LAB_00132243:
    __return_storage_ptr__->status = xVar31;
    __return_storage_ptr__->offset = (ptrdiff_t)pxVar8;
    local_90 = pxVar13;
  }
  goto LAB_00132260;
}

Assistant:

PUGI__FN xml_parse_result load_buffer_impl(xml_document_struct* doc, xml_node_struct* root, void* contents, size_t size, unsigned int options, xml_encoding encoding, bool is_mutable, bool own, char_t** out_buffer)
	{
		// check input buffer
		if (!contents && size) return make_parse_result(status_io_error);

		// get actual encoding
		xml_encoding buffer_encoding = impl::get_buffer_encoding(encoding, contents, size);

		// if convert_buffer below throws bad_alloc, we still need to deallocate contents if we own it
		auto_deleter<void> contents_guard(own ? contents : 0, xml_memory::deallocate);

		// get private buffer
		char_t* buffer = 0;
		size_t length = 0;

		// coverity[var_deref_model]
		if (!impl::convert_buffer(buffer, length, buffer_encoding, contents, size, is_mutable)) return impl::make_parse_result(status_out_of_memory);

		// after this we either deallocate contents (below) or hold on to it via doc->buffer, so we don't need to guard it
		contents_guard.release();

		// delete original buffer if we performed a conversion
		if (own && buffer != contents && contents) impl::xml_memory::deallocate(contents);

		// grab onto buffer if it's our buffer, user is responsible for deallocating contents himself
		if (own || buffer != contents) *out_buffer = buffer;

		// store buffer for offset_debug
		doc->buffer = buffer;

		// parse
		xml_parse_result res = impl::xml_parser::parse(buffer, length, doc, root, options);

		// remember encoding
		res.encoding = buffer_encoding;

		return res;
	}